

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

int32 vector_maxcomp_float32(float32 *val,int32 len)

{
  int32 iVar1;
  ulong uVar2;
  int32 iVar3;
  
  iVar3 = 0;
  if (1 < len) {
    iVar3 = 0;
    uVar2 = 1;
    do {
      iVar1 = (int32)uVar2;
      if ((float)val[uVar2] < (float)val[iVar3] || (float)val[uVar2] == (float)val[iVar3]) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  return iVar3;
}

Assistant:

int32
vector_maxcomp_float32(float32 * val, int32 len)
{
    int32 i, bi;

    bi = 0;
    for (i = 1; i < len; i++) {
        if (val[i] > val[bi])
            bi = i;
    }
    return bi;
}